

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O3

void __thiscall CServerBrowserFilter::CServerFilter::CServerFilter(CServerFilter *this)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar1 = (this->m_FilterInfo).m_aGametypeExclusive;
  this->m_pServerBrowserFilter = (CServerBrowserFilter *)0x0;
  (this->m_FilterInfo).m_SortHash = 0;
  (this->m_FilterInfo).m_Ping = 0;
  (this->m_FilterInfo).m_Country = 0;
  (this->m_FilterInfo).m_ServerLevel = 0;
  lVar2 = -0x80;
  pcVar3 = pcVar1;
  do {
    pcVar1[lVar2] = '\0';
    *pcVar3 = '\0';
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0);
  (this->m_FilterInfo).m_aAddress[0] = '\0';
  this->m_NumSortedPlayers = 0;
  this->m_NumSortedServers = 0;
  this->m_pSortedServerlist = (int *)0x0;
  this->m_SortedServersCapacity = 0;
  return;
}

Assistant:

CServerBrowserFilter::CServerFilter::CServerFilter()
{
	m_pServerBrowserFilter = 0;

	m_FilterInfo.m_SortHash = 0;
	m_FilterInfo.m_Ping = 0;
	m_FilterInfo.m_Country = 0;
	m_FilterInfo.m_ServerLevel = 0;
	for(int i = 0; i < CServerFilterInfo::MAX_GAMETYPES; ++i)
	{
		m_FilterInfo.m_aGametype[i][0] = 0;
		m_FilterInfo.m_aGametypeExclusive[i] = false;
	}
	m_FilterInfo.m_aAddress[0] = 0;

	m_NumSortedPlayers = 0;
	m_NumSortedServers = 0;
	m_SortedServersCapacity = 0;

	m_pSortedServerlist = 0;
}